

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_556bc6::SerialQueueImpl::run(SerialQueueImpl *this)

{
  function<void_()> *__x;
  code *pcVar1;
  unique_lock<std::mutex> lock;
  function<void_()> fn;
  unique_lock<std::mutex> local_70;
  mutex *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_60 = &this->operationsMutex;
  do {
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_70._M_device = local_60;
    local_70._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_70);
    local_70._M_owns = true;
    while (__x = (this->operations).
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur,
          (this->operations).
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur == __x) {
      std::condition_variable::wait((unique_lock *)&this->readyOperationsCondition);
    }
    std::function<void_()>::operator=((function<void_()> *)&local_58,__x);
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
              (&this->operations);
    if (local_70._M_owns == true) {
      std::unique_lock<std::mutex>::unlock(&local_70);
    }
    pcVar1 = local_48;
    if (local_48 != (code *)0x0) {
      (*pcStack_40)(&local_58);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  } while (pcVar1 != (code *)0x0);
  return;
}

Assistant:

void run() {
    while (true) {
      // Get the next operation from the queue.
      std::function<void(void)> fn;
      {
        std::unique_lock<std::mutex> lock(operationsMutex);

        // While the queue is empty, wait for an item.
        while (operations.empty()) {
          readyOperationsCondition.wait(lock);
        }

        fn = operations.front();
        operations.pop_front();
      }

      // If we got a nil function, the queue is shutting down.
      if (!fn)
        break;
      
      // Execute the operation.
      fn();
    }
  }